

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::AssocArrayDeleteMethod(AssocArrayDeleteMethod *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Delete,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005efba8;
  return;
}

Assistant:

AssocArrayDeleteMethod() :
        SystemSubroutine(KnownSystemName::Delete, SubroutineKind::Function) {}